

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

bool __thiscall xmrig::Client::isCriticalError(Client *this,char *message)

{
  int iVar1;
  char *in_RSI;
  bool local_1;
  
  if (in_RSI == (char *)0x0) {
    local_1 = false;
  }
  else {
    iVar1 = strncasecmp(in_RSI,"Unauthenticated",0xf);
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      iVar1 = strncasecmp(in_RSI,"your IP is banned",0x11);
      if (iVar1 == 0) {
        local_1 = true;
      }
      else {
        iVar1 = strncasecmp(in_RSI,"IP Address currently banned",0x1b);
        if (iVar1 == 0) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool xmrig::Client::isCriticalError(const char *message)
{
    if (!message) {
        return false;
    }

    if (strncasecmp(message, "Unauthenticated", 15) == 0) {
        return true;
    }

    if (strncasecmp(message, "your IP is banned", 17) == 0) {
        return true;
    }

    if (strncasecmp(message, "IP Address currently banned", 27) == 0) {
        return true;
    }

    return false;
}